

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgstrf.c
# Opt level: O1

void dgstrf(superlu_options_t *options,SuperMatrix *A,int relax,int panel_size,int *etree,void *work
           ,int_t lwork,int *perm_c,int *perm_r,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,
           SuperLUStat_t *stat,int_t *info)

{
  uint n;
  int iVar1;
  int_t *piVar2;
  int *et;
  int iVar3;
  uint n_00;
  int_t iVar4;
  int_t iVar5;
  uint uVar6;
  int iVar7;
  int *addr;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int_t *piVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  int nseg;
  int *local_178;
  int *repfnz;
  int *segrep;
  fact_t local_160;
  int nseg1;
  int *local_158;
  double *dense;
  int_t *xprune;
  superlu_options_t *local_140;
  int *local_138;
  int *marker;
  int_t nnzU;
  int_t nnzL;
  int usepr;
  int pivrow;
  int_t nzlumax;
  ulong local_110;
  int_t *local_108;
  ulong local_100;
  ulong local_f8;
  int_t *local_f0;
  double *tempv;
  int_t *xplore;
  int local_d4;
  int_t *local_d0;
  int_t *local_c8;
  int *local_c0;
  int *local_b8;
  SuperMatrix *local_b0;
  int *local_a8;
  ulong local_a0;
  int_t *local_98;
  int_t *local_90;
  int_t *local_88;
  double local_80;
  int *panel_lsub;
  int *parent;
  double *dwork;
  int *iwork;
  int_t *local_58;
  long local_50;
  long local_48;
  flops_t *local_40;
  long local_38;
  
  local_178 = (int *)CONCAT44(local_178._4_4_,relax);
  local_158 = etree;
  iVar3 = sp_ienv(6);
  local_160 = options->Fact;
  local_80 = options->DiagPivotThresh;
  local_a8 = stat->panel_histo;
  local_40 = stat->ops;
  uVar6 = A->nrow;
  local_110 = (ulong)uVar6;
  n = A->ncol;
  local_a0 = (ulong)n;
  n_00 = n;
  if ((int)uVar6 < (int)n) {
    n_00 = uVar6;
  }
  piVar12 = (int_t *)A->Store;
  local_38 = *(long *)(piVar12 + 2);
  local_98 = *(int_t **)(piVar12 + 4);
  local_88 = *(int_t **)(piVar12 + 6);
  local_90 = *(int_t **)(piVar12 + 8);
  local_100 = (ulong)(uint)panel_size;
  local_b0 = A;
  iVar4 = dLUMemInit(local_160,work,lwork,uVar6,n,*piVar12,panel_size,(double)iVar3,L,U,Glu,&iwork,
                     &dwork);
  uVar14 = local_a0;
  uVar10 = local_110;
  *info = iVar4;
  if (iVar4 == 0) {
    local_b8 = Glu->xsup;
    local_c0 = Glu->supno;
    local_c8 = Glu->xlsub;
    local_d0 = Glu->xlusup;
    local_f0 = Glu->xusub;
    iVar15 = (int)local_110;
    iVar13 = (int)local_a0;
    iVar3 = (int)local_100;
    local_140 = options;
    SetIWork(iVar15,iVar13,iVar3,iwork,&segrep,&parent,&xplore,&repfnz,&panel_lsub,&xprune,&marker);
    dSetRWork(iVar15,iVar3,dwork,&dense,&tempv);
    usepr = (int)(local_160 == SamePattern_SameRowPerm);
    if (local_160 == SamePattern_SameRowPerm) {
      local_138 = int32Malloc(iVar15);
      iVar3 = (int)local_178;
      if (0 < iVar15) {
        uVar11 = 0;
        do {
          local_138[perm_r[uVar11]] = (int)uVar11;
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
    }
    else {
      local_138 = (int *)0x0;
      iVar3 = (int)local_178;
    }
    et = local_158;
    addr = int32Malloc(iVar13);
    if (0 < iVar13) {
      uVar10 = 0;
      do {
        addr[perm_c[uVar10]] = (int)uVar10;
        uVar10 = uVar10 + 1;
      } while (uVar14 != uVar10);
    }
    local_108 = intMalloc(iVar13);
    if (local_140->SymmetricMode == YES) {
      heap_relax_snode(iVar13,et,iVar3,marker,local_108);
    }
    else {
      relax_snode(iVar13,et,iVar3,marker,local_108);
    }
    uVar10 = local_110;
    iVar15 = (int)local_110;
    ifill(perm_r,iVar15,-1);
    ifill(marker,iVar15 * 3,-1);
    *local_c0 = -1;
    iVar3 = 0;
    *local_d0 = 0;
    *local_f0 = 0;
    *local_c8 = 0;
    *local_b8 = 0;
    if (0 < (int)n_00) {
      local_58 = local_108 + 1;
      local_50 = (long)iVar15 * 4;
      local_48 = (long)iVar15 << 3;
      uVar11 = 0;
      iVar3 = 0;
      local_178 = addr;
      do {
        iVar13 = (int)uVar11;
        uVar14 = (ulong)iVar13;
        iVar15 = local_108[uVar14];
        if (iVar15 == -1) {
          local_158 = (int *)(uVar11 & 0xffffffff);
          uVar6 = (int)local_100 + iVar13;
          if ((int)n_00 <= (int)uVar6) {
            uVar6 = n_00;
          }
          uVar11 = 0;
          do {
            if ((long)(int)uVar6 <= (long)(uVar14 + 1 + uVar11)) {
              uVar6 = iVar13 + (int)uVar11 + 1;
              uVar9 = local_100;
              goto LAB_00105af1;
            }
            uVar9 = uVar11 + 1;
            lVar8 = uVar14 + uVar11;
            uVar11 = uVar9;
          } while (local_58[lVar8] == -1);
          uVar6 = iVar13 + (int)uVar9;
LAB_00105af1:
          iVar15 = n_00 - iVar13;
          if (uVar6 != n_00) {
            iVar15 = (int)uVar9;
          }
          local_a8[iVar15] = local_a8[iVar15] + 1;
          dpanel_dfs((int)uVar10,iVar15,iVar13,local_b0,perm_r,&nseg1,dense,panel_lsub,segrep,repfnz
                     ,xprune,marker,parent,xplore,Glu);
          dpanel_bmod((int)uVar10,iVar15,iVar13,nseg1,dense,tempv,segrep,repfnz,Glu,stat);
          uVar11 = (ulong)(uint)(iVar13 + iVar15);
          if (0 < iVar15) {
            local_140 = (superlu_options_t *)(long)(iVar13 + iVar15);
            lVar16 = 0;
            lVar8 = 0;
            local_f8 = uVar11;
            do {
              nseg = nseg1;
              iVar13 = (int)uVar14;
              iVar15 = dcolumn_dfs((int)local_110,iVar13,perm_r,&nseg,
                                   (int *)((long)panel_lsub + lVar8),segrep,
                                   (int *)((long)repfnz + lVar8),xprune,marker,parent,xplore,Glu);
              *info = iVar15;
              if (iVar15 != 0) {
                return;
              }
              iVar15 = dcolumn_bmod(iVar13,nseg - nseg1,(double *)((long)dense + lVar16),tempv,
                                    segrep + nseg1,(int *)((long)repfnz + lVar8),(int)local_158,Glu,
                                    stat);
              *info = iVar15;
              if (iVar15 != 0) {
                return;
              }
              iVar15 = dcopy_to_ucol(iVar13,nseg,segrep,(int *)((long)repfnz + lVar8),perm_r,
                                     (double *)((long)dense + lVar16),Glu);
              *info = iVar15;
              if (iVar15 != 0) {
                return;
              }
              iVar7 = dpivotL(iVar13,local_80,&usepr,perm_r,local_138,local_178,&pivrow,Glu,stat);
              *info = iVar7;
              iVar15 = iVar3;
              if (iVar3 == 0) {
                iVar15 = iVar7;
              }
              if (iVar7 != 0) {
                iVar3 = iVar15;
              }
              dpruneL(iVar13,perm_r,pivrow,nseg,segrep,(int *)((long)repfnz + lVar8),xprune,Glu);
              resetrep_col(nseg,segrep,(int *)((long)repfnz + lVar8));
              uVar14 = uVar14 + 1;
              lVar8 = lVar8 + local_50;
              lVar16 = lVar16 + local_48;
              uVar11 = local_f8;
            } while ((long)uVar14 < (long)local_140);
          }
        }
        else {
          local_a8[(long)(iVar15 - iVar13) + 1] = local_a8[(long)(iVar15 - iVar13) + 1] + 1;
          local_d4 = iVar15;
          iVar4 = dsnode_dfs(iVar13,iVar15,local_98,local_88,local_90,xprune,marker,Glu);
          *info = iVar4;
          if (iVar4 != 0) {
            return;
          }
          local_158 = (int *)CONCAT44(local_158._4_4_,local_f0[uVar14]);
          iVar4 = local_d0[uVar14];
          local_140 = (superlu_options_t *)(long)local_c0[uVar14];
          local_f8 = (ulong)local_b8[(long)local_140];
          iVar7 = local_c8[local_f8 + 1];
          iVar1 = local_c8[local_f8];
          nzlumax = Glu->nzlumax;
          while (nzlumax < (iVar7 - iVar1) * ((iVar15 - iVar13) + 1) + iVar4) {
            iVar5 = dLUMemXpand(iVar13,iVar4,LUSUP,&nzlumax,Glu);
            *info = iVar5;
            if (iVar5 != 0) {
              return;
            }
          }
          if (iVar13 <= local_d4) {
            iVar15 = local_d4 + 1;
            do {
              local_f0[uVar14 + 1] = (int_t)local_158;
              lVar8 = (long)local_88[uVar14];
              iVar13 = local_90[uVar14];
              if (local_88[uVar14] < iVar13) {
                do {
                  dense[local_98[lVar8]] = *(double *)(local_38 + lVar8 * 8);
                  lVar8 = lVar8 + 1;
                } while (iVar13 != lVar8);
              }
              uVar11 = uVar14 + 1;
              dsnode_bmod((int)uVar14,(int)local_140,(int)local_f8,dense,tempv,Glu,stat);
              iVar7 = dpivotL((int)uVar14,local_80,&usepr,perm_r,local_138,local_178,&pivrow,Glu,
                              stat);
              *info = iVar7;
              iVar13 = iVar3;
              if (iVar3 == 0) {
                iVar13 = iVar7;
              }
              if (iVar7 != 0) {
                iVar3 = iVar13;
              }
              uVar14 = uVar11;
            } while (iVar15 != (int)uVar11);
          }
        }
        addr = local_178;
        uVar10 = local_110;
        uVar14 = local_a0;
      } while ((int)uVar11 < (int)n_00);
    }
    piVar12 = local_108;
    *info = iVar3;
    uVar11 = (ulong)(iVar3 - 1);
    if (iVar3 == 0) {
      uVar11 = uVar14 & 0xffffffff;
    }
    iVar3 = (int)uVar10;
    if (0 < iVar3 && (int)uVar11 < iVar3) {
      uVar9 = 1;
      do {
        if (perm_r[uVar9 - 1] == -1) {
          perm_r[uVar9 - 1] = (int)uVar11;
          uVar11 = (ulong)((int)uVar11 + 1);
        }
      } while ((uVar9 < uVar10) && (uVar9 = uVar9 + 1, (int)uVar11 < iVar3));
    }
    countnz(n_00,xprune,&nnzL,&nnzU,Glu);
    fixupL(n_00,perm_r,Glu);
    dLUWorkFree(iwork,dwork,Glu);
    superlu_free(xplore);
    superlu_free(xprune);
    if (local_160 == SamePattern_SameRowPerm) {
      piVar2 = (int_t *)L->Store;
      *piVar2 = nnzL;
      piVar2[1] = Glu->supno[(int)uVar14];
      *(void **)(piVar2 + 2) = Glu->lusup;
      *(int_t **)(piVar2 + 4) = Glu->xlusup;
      *(int_t **)(piVar2 + 6) = Glu->lsub;
      *(int_t **)(piVar2 + 8) = Glu->xlsub;
      piVar2 = (int_t *)U->Store;
      *piVar2 = nnzU;
      *(void **)(piVar2 + 2) = Glu->ucol;
      *(int_t **)(piVar2 + 4) = Glu->usub;
      *(int_t **)(piVar2 + 6) = Glu->xusub;
    }
    else {
      dCreate_SuperNode_Matrix
                (L,local_b0->nrow,n_00,nnzL,(double *)Glu->lusup,Glu->xlusup,Glu->lsub,Glu->xlsub,
                 Glu->supno,Glu->xsup,SLU_SC,SLU_D,SLU_TRLU);
      piVar12 = local_108;
      dCreate_CompCol_Matrix
                (U,n_00,n_00,nnzU,(double *)Glu->ucol,Glu->usub,Glu->xusub,SLU_NC,SLU_D,SLU_TRU);
    }
    local_40[7] = local_40[0x13] + local_40[0x14] + local_40[7];
    iVar3 = Glu->num_expansions + -1;
    Glu->num_expansions = iVar3;
    stat->expansions = iVar3;
    if (local_160 == SamePattern_SameRowPerm) {
      superlu_free(local_138);
    }
    superlu_free(addr);
    superlu_free(piVar12);
  }
  return;
}

Assistant:

void
dgstrf (superlu_options_t *options, SuperMatrix *A,
        int relax, int panel_size, int *etree, void *work, int_t lwork,
        int *perm_c, int *perm_r, SuperMatrix *L, SuperMatrix *U,
    	GlobalLU_t *Glu, /* persistent to facilitate multiple factorizations */
        SuperLUStat_t *stat, int_t *info)
{
    /* Local working arrays */
    NCPformat *Astore;
    int       *iperm_r = NULL; /* inverse of perm_r; used when 
                                  options->Fact == SamePattern_SameRowPerm */
    int       *iperm_c; /* inverse of perm_c */
    int       *iwork;
    double    *dwork;
    int	      *segrep, *repfnz, *parent;
    int	      *panel_lsub; /* dense[]/panel_lsub[] pair forms a w-wide SPA */
    int_t     *xprune, *xplore;
    int	      *marker;
    double    *dense, *tempv;
    int       *relax_end;
    double    *a;
    int_t     *asub, *xa_begin, *xa_end;
    int_t     *xlsub, *xlusup, *xusub;
    int       *xsup, *supno;
    int_t     nzlumax;
    double fill_ratio = sp_ienv(6);  /* estimated fill ratio */

    /* Local scalars */
    fact_t    fact = options->Fact;
    double    diag_pivot_thresh = options->DiagPivotThresh;
    int       pivrow;   /* pivotal row number in the original matrix A */
    int       nseg1;	/* no of segments in U-column above panel row jcol */
    int       nseg;	/* no of segments in each U-column */
    register int jcol, jj;
    register int kcol;	/* end column of a relaxed snode */
    register int icol;
    int_t     i, k, iinfo, new_next, nextlu, nextu;
    int       m, n, min_mn, jsupno, fsupc;
    int       w_def;	/* upper bound on panel width */
    int       usepr, iperm_r_allocated = 0;
    int_t     nnzL, nnzU;
    int       *panel_histo = stat->panel_histo;
    flops_t   *ops = stat->ops;

    iinfo    = 0;
    m        = A->nrow;
    n        = A->ncol;
    min_mn   = SUPERLU_MIN(m, n);
    Astore   = A->Store;
    a        = Astore->nzval;
    asub     = Astore->rowind;
    xa_begin = Astore->colbeg;
    xa_end   = Astore->colend;

    /* Allocate storage common to the factor routines */
    *info = dLUMemInit(fact, work, lwork, m, n, Astore->nnz,
                       panel_size, fill_ratio, L, U, Glu, &iwork, &dwork);
    if ( *info ) return;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    xlsub   = Glu->xlsub;
    xlusup  = Glu->xlusup;
    xusub   = Glu->xusub;
    
    SetIWork(m, n, panel_size, iwork, &segrep, &parent, &xplore,
	     &repfnz, &panel_lsub, &xprune, &marker);
    dSetRWork(m, panel_size, dwork, &dense, &tempv);
    
    usepr = (fact == SamePattern_SameRowPerm);
    if ( usepr ) {
	/* Compute the inverse of perm_r */
	iperm_r = (int *) int32Malloc(m);
	for (k = 0; k < m; ++k) iperm_r[perm_r[k]] = k;
	iperm_r_allocated = 1;
    }
    iperm_c = (int *) int32Malloc(n);
    for (k = 0; k < n; ++k) iperm_c[perm_c[k]] = k;

    /* Identify relaxed snodes */
    relax_end = (int *) intMalloc(n);
    if ( options->SymmetricMode == YES ) {
        heap_relax_snode(n, etree, relax, marker, relax_end); 
    } else {
        relax_snode(n, etree, relax, marker, relax_end); 
    }
    
    ifill (perm_r, m, SLU_EMPTY);
    ifill (marker, m * NO_MARKER, SLU_EMPTY);
    supno[0] = -1;
    xsup[0]  = xlsub[0] = xusub[0] = xlusup[0] = 0;
    w_def    = panel_size;

    /* 
     * Work on one "panel" at a time. A panel is one of the following: 
     *	   (a) a relaxed supernode at the bottom of the etree, or
     *	   (b) panel_size contiguous columns, defined by the user
     */
    for (jcol = 0; jcol < min_mn; ) {

	if ( relax_end[jcol] != SLU_EMPTY ) { /* start of a relaxed snode */
   	    kcol = relax_end[jcol];	  /* end of the relaxed snode */
	    panel_histo[kcol-jcol+1]++;

	    /* --------------------------------------
	     * Factorize the relaxed supernode(jcol:kcol) 
	     * -------------------------------------- */
	    /* Determine the union of the row structure of the snode */
	    if ( (*info = dsnode_dfs(jcol, kcol, asub, xa_begin, xa_end,
				    xprune, marker, Glu)) != 0 )
		return;

            nextu    = xusub[jcol];
	    nextlu   = xlusup[jcol];
	    jsupno   = supno[jcol];
	    fsupc    = xsup[jsupno];
	    new_next = nextlu + (xlsub[fsupc+1]-xlsub[fsupc])*(kcol-jcol+1);
	    nzlumax = Glu->nzlumax;
	    while ( new_next > nzlumax ) {
		if ( (*info = dLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu)) )
		    return;
	    }
    
	    for (icol = jcol; icol<= kcol; icol++) {
		xusub[icol+1] = nextu;
		
    		/* Scatter into SPA dense[*] */
    		for (k = xa_begin[icol]; k < xa_end[icol]; k++)
        	    dense[asub[k]] = a[k];

	       	/* Numeric update within the snode */
	        dsnode_bmod(icol, jsupno, fsupc, dense, tempv, Glu, stat);

		if ( (*info = dpivotL(icol, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;
		
#if ( DEBUGlevel>=2 )
		dprint_lu_col("[1]: ", icol, pivrow, xprune, Glu);
#endif

	    }

	    jcol = icol;

	} else { /* Work on one panel of panel_size columns */
	    
	    /* Adjust panel_size so that a panel won't overlap with the next 
	     * relaxed snode.
	     */
	    panel_size = w_def;
	    for (k = jcol + 1; k < SUPERLU_MIN(jcol+panel_size, min_mn); k++) 
		if ( relax_end[k] != SLU_EMPTY ) {
		    panel_size = k - jcol;
		    break;
		}
	    if ( k == min_mn ) panel_size = min_mn - jcol;
	    panel_histo[panel_size]++;

	    /* symbolic factor on a panel of columns */
	    dpanel_dfs(m, panel_size, jcol, A, perm_r, &nseg1,
		      dense, panel_lsub, segrep, repfnz, xprune,
		      marker, parent, xplore, Glu);
	    
	    /* numeric sup-panel updates in topological order */
	    dpanel_bmod(m, panel_size, jcol, nseg1, dense,
		        tempv, segrep, repfnz, Glu, stat);
	    
	    /* Sparse LU within the panel, and below panel diagonal */
    	    for ( jj = jcol; jj < jcol + panel_size; jj++) {
 		k = (jj - jcol) * m; /* column index for w-wide arrays */

		nseg = nseg1;	/* Begin after all the panel segments */

	    	if ((*info = dcolumn_dfs(m, jj, perm_r, &nseg, &panel_lsub[k],
					segrep, &repfnz[k], xprune, marker,
					parent, xplore, Glu)) != 0) return;

	      	/* Numeric updates */
	    	if ((*info = dcolumn_bmod(jj, (nseg - nseg1), &dense[k],
					 tempv, &segrep[nseg1], &repfnz[k],
					 jcol, Glu, stat)) != 0) return;
		
	        /* Copy the U-segments to ucol[*] */
		if ((*info = dcopy_to_ucol(jj, nseg, segrep, &repfnz[k],
					  perm_r, &dense[k], Glu)) != 0)
		    return;

	    	if ( (*info = dpivotL(jj, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;

		/* Prune columns (0:jj-1) using column jj */
	    	dpruneL(jj, perm_r, pivrow, nseg, segrep,
                        &repfnz[k], xprune, Glu);

		/* Reset repfnz[] for this column */
	    	resetrep_col (nseg, segrep, &repfnz[k]);
		
#if ( DEBUGlevel>=2 )
		dprint_lu_col("[2]: ", jj, pivrow, xprune, Glu);
#endif

	    }

   	    jcol += panel_size;	/* Move to the next panel */

	} /* else */

    } /* for */

    *info = iinfo;

    /* Complete perm_r[] for rank-deficient or tall-skinny matrices */
    /* k is the rank of U
       pivots have been completed for rows < k
       Now fill in the pivots for rows k to m */
    k = iinfo == 0 ? n : (int)iinfo - 1;
    if (m > k) {
        /* if k == m, then all the row permutations are complete and
           we can short circuit looking through the rest of the vector */
        for (i = 0; i < m && k < m; ++i) {
            if (perm_r[i] == SLU_EMPTY) {
                perm_r[i] = k;
                ++k;
            }

        }
    }
    
    countnz(min_mn, xprune, &nnzL, &nnzU, Glu);
    fixupL(min_mn, perm_r, Glu);

    dLUWorkFree(iwork, dwork, Glu); /* Free work space and compress storage */
    SUPERLU_FREE(xplore);
    SUPERLU_FREE(xprune);

    if ( fact == SamePattern_SameRowPerm ) {
        /* L and U structures may have changed due to possibly different
	   pivoting, even though the storage is available.
	   There could also be memory expansions, so the array locations
           may have changed, */
        ((SCformat *)L->Store)->nnz = nnzL;
	((SCformat *)L->Store)->nsuper = Glu->supno[n];
	((SCformat *)L->Store)->nzval = (double *) Glu->lusup;
	((SCformat *)L->Store)->nzval_colptr = Glu->xlusup;
	((SCformat *)L->Store)->rowind = Glu->lsub;
	((SCformat *)L->Store)->rowind_colptr = Glu->xlsub;
	((NCformat *)U->Store)->nnz = nnzU;
	((NCformat *)U->Store)->nzval = (double *) Glu->ucol;
	((NCformat *)U->Store)->rowind = Glu->usub;
	((NCformat *)U->Store)->colptr = Glu->xusub;
    } else {
        dCreate_SuperNode_Matrix(L, A->nrow, min_mn, nnzL, 
	      (double *) Glu->lusup, Glu->xlusup, 
              Glu->lsub, Glu->xlsub, Glu->supno, Glu->xsup,
              SLU_SC, SLU_D, SLU_TRLU);
    	dCreate_CompCol_Matrix(U, min_mn, min_mn, nnzU, 
	      (double *) Glu->ucol, Glu->usub, Glu->xusub,
              SLU_NC, SLU_D, SLU_TRU);
    }
    
    ops[FACT] += ops[TRSV] + ops[GEMV];	
    stat->expansions = --(Glu->num_expansions);
    
    if ( iperm_r_allocated ) SUPERLU_FREE (iperm_r);
    SUPERLU_FREE (iperm_c);
    SUPERLU_FREE (relax_end);

}